

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_or_prepare_insert_non_soo<char_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,char **key)

{
  ctrl_t *pcVar1;
  char *__s;
  ushort uVar2;
  bool bVar3;
  char cVar4;
  ushort uVar5;
  uint32_t uVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  ctrl_t *pcVar10;
  slot_type *psVar11;
  size_t sVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  __m128i match;
  ctrl_t cVar16;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  undefined1 auVar17 [16];
  iterator iVar33;
  string_view v;
  FindInfo FVar34;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_98;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  *local_80;
  ctrl_t *local_78;
  size_t local_70;
  EqualElement<const_char_*> local_68;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  bVar3 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)this);
  if (bVar3) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xede,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)this);
  __s = *key;
  sVar8 = strlen(__s);
  v._M_str = __s;
  v._M_len = sVar8;
  sVar9 = StringHash::operator()((StringHash *)this,v);
  probe(&local_98,(CommonFields *)this,sVar9);
  pcVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)this);
  auVar15 = ZEXT216(CONCAT11((char)sVar9,(char)sVar9) & 0x7f7f);
  auVar15 = pshuflw(auVar15,auVar15,0);
  uVar14 = auVar15._0_4_;
  local_48._4_4_ = uVar14;
  local_48._0_4_ = uVar14;
  local_48._8_4_ = uVar14;
  local_48._12_4_ = uVar14;
  local_70 = sVar9;
  do {
    pcVar1 = pcVar10 + local_98.offset_;
    auVar15[0] = -(local_48[0] == *pcVar1);
    auVar15[1] = -(local_48[1] == pcVar1[1]);
    auVar15[2] = -(local_48[2] == pcVar1[2]);
    auVar15[3] = -(local_48[3] == pcVar1[3]);
    auVar15[4] = -(local_48[4] == pcVar1[4]);
    auVar15[5] = -(local_48[5] == pcVar1[5]);
    auVar15[6] = -(local_48[6] == pcVar1[6]);
    auVar15[7] = -(local_48[7] == pcVar1[7]);
    auVar15[8] = -(local_48[8] == pcVar1[8]);
    auVar15[9] = -(local_48[9] == pcVar1[9]);
    auVar15[10] = -(local_48[10] == pcVar1[10]);
    auVar15[0xb] = -(local_48[0xb] == pcVar1[0xb]);
    auVar15[0xc] = -(local_48[0xc] == pcVar1[0xc]);
    auVar15[0xd] = -(local_48[0xd] == pcVar1[0xd]);
    auVar15[0xe] = -(local_48[0xe] == pcVar1[0xe]);
    auVar15[0xf] = -(local_48[0xf] == pcVar1[0xf]);
    cVar16 = *pcVar1;
    cVar18 = pcVar1[1];
    cVar19 = pcVar1[2];
    cVar20 = pcVar1[3];
    cVar21 = pcVar1[4];
    cVar22 = pcVar1[5];
    cVar23 = pcVar1[6];
    cVar24 = pcVar1[7];
    cVar25 = pcVar1[8];
    cVar26 = pcVar1[9];
    cVar27 = pcVar1[10];
    cVar28 = pcVar1[0xb];
    cVar29 = pcVar1[0xc];
    cVar30 = pcVar1[0xd];
    cVar31 = pcVar1[0xe];
    cVar32 = pcVar1[0xf];
    for (uVar5 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
        ; uVar5 != 0; uVar5 = uVar5 - 1 & uVar5) {
      local_80 = __return_storage_ptr__;
      local_78 = pcVar10;
      local_58 = cVar16;
      cStack_57 = cVar18;
      cStack_56 = cVar19;
      cStack_55 = cVar20;
      cStack_54 = cVar21;
      cStack_53 = cVar22;
      cStack_52 = cVar23;
      cStack_51 = cVar24;
      cStack_50 = cVar25;
      cStack_4f = cVar26;
      cStack_4e = cVar27;
      cStack_4d = cVar28;
      cStack_4c = cVar29;
      cStack_4b = cVar30;
      cStack_4a = cVar31;
      cStack_49 = cVar32;
      uVar6 = TrailingZeros<unsigned_short>(uVar5);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      psVar11 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this);
      bVar3 = DecomposeValue<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>::EqualElement<char_const*>,std::basic_string_view<char,std::char_traits<char>>&>
                        (&local_68,psVar11 + (local_98.offset_ + uVar6 & local_98.mask_));
      __return_storage_ptr__ = local_80;
      if (bVar3) {
        local_98.mask_ = uVar6 + local_98.offset_ & local_98.mask_;
        bVar3 = false;
        goto LAB_001e87c0;
      }
      pcVar10 = local_78;
      cVar16 = local_58;
      cVar18 = cStack_57;
      cVar19 = cStack_56;
      cVar20 = cStack_55;
      cVar21 = cStack_54;
      cVar22 = cStack_53;
      cVar23 = cStack_52;
      cVar24 = cStack_51;
      cVar25 = cStack_50;
      cVar26 = cStack_4f;
      cVar27 = cStack_4e;
      cVar28 = cStack_4d;
      cVar29 = cStack_4c;
      cVar30 = cStack_4b;
      cVar31 = cStack_4a;
      cVar32 = cStack_49;
    }
    auVar17[0] = -(cVar16 == kEmpty);
    auVar17[1] = -(cVar18 == kEmpty);
    auVar17[2] = -(cVar19 == kEmpty);
    auVar17[3] = -(cVar20 == kEmpty);
    auVar17[4] = -(cVar21 == kEmpty);
    auVar17[5] = -(cVar22 == kEmpty);
    auVar17[6] = -(cVar23 == kEmpty);
    auVar17[7] = -(cVar24 == kEmpty);
    auVar17[8] = -(cVar25 == kEmpty);
    auVar17[9] = -(cVar26 == kEmpty);
    auVar17[10] = -(cVar27 == kEmpty);
    auVar17[0xb] = -(cVar28 == kEmpty);
    auVar17[0xc] = -(cVar29 == kEmpty);
    auVar17[0xd] = -(cVar30 == kEmpty);
    auVar17[0xe] = -(cVar31 == kEmpty);
    auVar17[0xf] = -(cVar32 == kEmpty);
    uVar5 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf;
    if (uVar5 != 0) {
      sVar12 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this);
      pcVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this);
      sVar9 = local_70;
      cVar4 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (sVar12,local_70,pcVar10);
      if (cVar4 == '\0') {
        uVar7 = TrailingZeros<unsigned_short>(uVar5);
      }
      else {
        uVar2 = 0xf;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar7 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
      }
      FVar34.offset = uVar7 + local_98.offset_ & local_98.mask_;
      FVar34.probe_length = local_98.index_;
      local_98.mask_ =
           absl::lts_20240722::container_internal::PrepareInsertNonSoo
                     ((CommonFields *)this,sVar9,FVar34,
                      (PolicyFunctions *)GetPolicyFunctions()::value);
      bVar3 = true;
LAB_001e87c0:
      iVar33 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this,local_98.mask_);
      __return_storage_ptr__->first = iVar33;
      __return_storage_ptr__->second = bVar3;
      return __return_storage_ptr__;
    }
    uVar13 = local_98.index_ + 0x10;
    local_98.offset_ = local_98.offset_ + uVar13 & local_98.mask_;
    local_98.index_ = uVar13;
    sVar9 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)this);
    if (sVar9 < uVar13) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }